

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O1

void __thiscall OpenMD::EAM::calcForce(EAM *this,InteractionData *idat)

{
  pointer pEVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  pointer piVar9;
  pointer pEVar10;
  CubicSpline *pCVar11;
  RealType RVar12;
  undefined1 auVar13 [16];
  uint i;
  long lVar14;
  uint i_1;
  undefined8 *puVar15;
  long lVar16;
  long lVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  long lVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  RealType dvpdr;
  RealType phab;
  RealType rhb;
  RealType rha;
  RealType drhb;
  RealType drha;
  RealType dphb;
  RealType phb;
  RealType dpha;
  RealType pha;
  Vector<double,_3U> result;
  RealType local_160;
  RealType local_158;
  pointer local_150;
  RealType *local_148;
  double local_140;
  RealType local_138;
  RealType local_130;
  double local_128;
  double dStack_120;
  undefined1 local_118 [16];
  RealType local_108;
  RealType local_100;
  RealType local_f8;
  RealType local_f0;
  RealType local_e8;
  RealType local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  RealType local_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  RealType local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  if ((this->haveCutoffRadius_ == true) &&
     (this->eamRcut_ <= idat->rij && idat->rij != this->eamRcut_)) {
    return;
  }
  piVar9 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar10 = (this->EAMdata).
            super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar17 = (long)piVar9[idat->atid1];
  lVar16 = (long)piVar9[idat->atid2];
  local_150 = pEVar10 + lVar17;
  pEVar1 = pEVar10 + lVar16;
  local_b0 = pEVar10[lVar17].rcut;
  local_b8 = pEVar10[lVar16].rcut;
  local_d8 = (double)(lVar17 * 3);
  lVar19 = lVar16 * 0x40;
  local_140 = *(double *)
               (*(long *)&(this->MixingMap).
                          super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar17].
                          super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                          ._M_impl.super__Vector_impl_data + 0x30 + lVar19);
  lVar14 = 0;
  local_130 = 0.0;
  local_100 = 0.0;
  local_138 = 0.0;
  local_108 = 0.0;
  local_e0 = 0.0;
  local_e8 = 0.0;
  local_f0 = 0.0;
  local_f8 = 0.0;
  local_158 = 0.0;
  local_160 = 0.0;
  local_148 = &idat->rij;
  dVar4 = idat->rij;
  local_88 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  do {
    (&local_98)[lVar14] = (idat->d).super_Vector<double,_3U>.data_[lVar14] / dVar4;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  (this->rhat).super_Vector<double,_3U>.data_[2] = local_88;
  (this->rhat).super_Vector<double,_3U>.data_[0] = local_98;
  (this->rhat).super_Vector<double,_3U>.data_[1] = dStack_90;
  if ((*local_148 < local_b0) && (*local_148 < local_140)) {
    CubicSpline::getValueAndDerivativeAt
              ((local_150->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,local_148,&local_130,&local_100);
    lVar14 = *(long *)((long)&(((this->MixingMap).
                                super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                              )._M_impl.super__Vector_impl_data + (long)local_d8 * 8);
    pCVar11 = *(CubicSpline **)(lVar14 + lVar17 * 0x40);
    p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar14 + 8 + lVar17 * 0x40);
    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
      }
    }
    CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_e0,&local_e8);
    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
    }
  }
  if ((*local_148 < local_b8) && (*local_148 < local_140)) {
    CubicSpline::getValueAndDerivativeAt
              ((pEVar1->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,local_148,&local_138,&local_108);
    lVar14 = *(long *)&(this->MixingMap).
                       super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar16].
                       super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                       ._M_impl.super__Vector_impl_data;
    pCVar11 = *(CubicSpline **)(lVar14 + lVar19);
    p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar14 + 8 + lVar19);
    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
      }
    }
    CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_f0,&local_f8);
    if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
    }
  }
  bVar6 = local_150->isFluctuatingCharge;
  bVar7 = pEVar1->isFluctuatingCharge;
  lVar14 = *(long *)((long)&(((this->MixingMap).
                              super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                            )._M_impl.super__Vector_impl_data + (long)local_d8 * 8);
  cVar8 = *(char *)(lVar14 + 0x38 + lVar19);
  puVar15 = (undefined8 *)(lVar14 + lVar19);
  if ((bVar6 == false) && ((bVar7 & 1U) == 0)) {
    local_a8 = 0.0;
    dStack_a0 = 0.0;
    if (*local_148 <= local_140 && local_140 != *local_148) {
      pCVar11 = (CubicSpline *)*puVar15;
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15[1];
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        }
      }
      CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_158,&local_160);
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
      }
      local_78 = 0.0;
      dStack_70 = 0.0;
      local_d8 = 0.0;
      dStack_d0 = 0.0;
      local_c8 = 0.0;
      dStack_c0 = 0.0;
      dVar4 = 1.0;
      dVar5 = 1.0;
      goto LAB_00260d7b;
    }
    local_78 = 0.0;
    dStack_70 = 0.0;
    dVar4 = 1.0;
    dVar5 = 1.0;
LAB_00260671:
    dStack_d0 = 0.0;
    local_d8 = 0.0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    goto LAB_00260d7b;
  }
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_118 = ZEXT816(0x3ff0000000000000);
  local_128 = 1.0;
  dStack_120 = 0.0;
  if (bVar6 != false) {
    local_a8 = local_150->nValence;
    dStack_a0 = local_150->nMobile;
    dVar4 = idat->flucQ1;
    if (this->mixMeth_ == eamDream2) {
      local_128 = 0.0;
      dStack_120 = 0.0;
      if (dVar4 < local_a8) {
        if (-dStack_a0 < dVar4) {
          dStack_120 = (local_a8 + dStack_a0) * local_a8 * local_a8;
          local_128 = ((dStack_a0 + dVar4 + local_a8) * (dVar4 - local_a8) * (dVar4 - local_a8)) /
                      dStack_120;
        }
        else {
          local_128 = (dStack_a0 + local_a8) / local_a8;
          dStack_120 = dStack_a0;
        }
      }
    }
    else {
      local_128 = (local_a8 - dVar4) / local_a8;
      dStack_120 = dStack_a0;
    }
  }
  dVar5 = 0.0;
  dVar4 = 0.0;
  if ((bVar7 & 1U) != 0) {
    dVar4 = pEVar1->nValence;
    dVar5 = pEVar1->nMobile;
    dVar22 = idat->flucQ2;
    if (this->mixMeth_ == eamDream2) {
      local_118 = ZEXT816(0);
      if (dVar22 < dVar4) {
        if (dVar22 <= -dVar5) {
          local_118._8_4_ = SUB84(dVar5,0);
          local_118._0_8_ = (dVar5 + dVar4) / dVar4;
          local_118._12_4_ = (int)((ulong)dVar5 >> 0x20);
        }
        else {
          local_118._8_8_ = (dVar4 + dVar5) * dVar4 * dVar4;
          local_118._0_8_ =
               ((dVar5 + dVar22 + dVar4) * (dVar22 - dVar4) * (dVar22 - dVar4)) /
               (double)local_118._8_8_;
        }
      }
    }
    else {
      local_118._8_8_ = dVar5;
      local_118._0_8_ = (dVar4 - dVar22) / dVar4;
    }
  }
  local_78 = dVar4;
  dStack_70 = dVar5;
  local_58 = dStack_a0;
  dStack_50 = dStack_a0;
  local_48 = dVar5;
  dStack_40 = dVar5;
  if ((this->mixMeth_ & ~eamDream1) == eamJohnson) {
    dVar4 = *local_148;
    if ((dVar4 < local_b0) && (dVar4 < local_140)) {
      dVar22 = ((double)local_118._0_8_ / local_128) * 0.5;
      local_158 = dVar22 * (local_138 / local_130) * local_e0 + local_158;
      auVar32._8_8_ = (local_100 * local_138) / local_130;
      auVar32._0_8_ = local_108;
      auVar30._8_8_ = local_130;
      auVar30._0_8_ = local_130;
      auVar33 = divpd(auVar32,auVar30);
      local_160 = ((local_138 / local_130) * local_e8 + (auVar33._0_8_ - auVar33._8_8_) * local_e0)
                  * dVar22 + local_160;
      if (bVar6 != false) {
        idat->dVdFQ1 = (local_e0 * local_138 * (double)local_118._0_8_ * 0.5) /
                       (local_128 * local_128 * local_130 * dStack_a0) + idat->dVdFQ1;
      }
      if ((bVar7 & 1U) != 0) {
        idat->dVdFQ2 = (local_138 * local_e0 * -0.5) / (local_130 * dVar5 * local_128) +
                       idat->dVdFQ2;
      }
    }
    if ((dVar4 < local_b8) && (dVar4 < local_140)) {
      dVar4 = (local_128 / (double)local_118._0_8_) * 0.5;
      local_158 = dVar4 * (local_130 / local_138) * local_f0 + local_158;
      auVar31._8_8_ = (local_108 * local_130) / local_138;
      auVar31._0_8_ = local_100;
      auVar27._8_8_ = local_138;
      auVar27._0_8_ = local_138;
      auVar33 = divpd(auVar31,auVar27);
      local_160 = ((local_130 / local_138) * local_f8 + (auVar33._0_8_ - auVar33._8_8_) * local_f0)
                  * dVar4 + local_160;
      if (bVar6 != false) {
        idat->dVdFQ1 = (local_130 * local_f0 * -0.5) /
                       (dStack_a0 * local_138 * (double)local_118._0_8_) + idat->dVdFQ1;
      }
      if ((bVar7 & 1U) != 0) {
        idat->dVdFQ2 = (local_f0 * local_130 * local_128 * 0.5) /
                       ((double)local_118._0_8_ * (double)local_118._0_8_ * local_138 * dVar5) +
                       idat->dVdFQ2;
        dVar4 = (double)local_118._0_8_;
        dVar5 = local_128;
        goto LAB_00260671;
      }
    }
    dStack_d0 = 0.0;
    local_d8 = 0.0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
  }
  else {
    dVar4 = *local_148;
    if (cVar8 == '\0') {
      if ((dVar4 < local_b0) && (dVar4 < local_140)) {
        pCVar11 = (local_150->phiCC).
                  super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var18 = (local_150->phiCC).
                  super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          }
        }
        CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_e0,&local_e8);
        local_158 = (local_138 / local_130) * 0.5 * local_e0 + local_158;
        auVar23._8_8_ = (local_138 * local_100) / local_130;
        auVar23._0_8_ = local_108;
        auVar33._8_8_ = local_130;
        auVar33._0_8_ = local_130;
        auVar33 = divpd(auVar23,auVar33);
        local_160 = ((local_138 / local_130) * local_e8 + (auVar33._0_8_ - auVar33._8_8_) * local_e0
                    ) * 0.5 + local_160;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
      }
      if ((*local_148 < local_b8) && (*local_148 < local_140)) {
        pCVar11 = (pEVar1->phiCC).
                  super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var18 = (pEVar1->phiCC).
                  super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          }
        }
        CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_f0,&local_f8);
        local_158 = (local_130 / local_138) * 0.5 * local_f0 + local_158;
        auVar24._8_8_ = (local_130 * local_108) / local_138;
        auVar24._0_8_ = local_100;
        auVar13._8_8_ = local_138;
        auVar13._0_8_ = local_138;
        auVar33 = divpd(auVar24,auVar13);
        local_160 = ((local_130 / local_138) * local_f8 + (auVar33._0_8_ - auVar33._8_8_) * local_f0
                    ) * 0.5 + local_160;
        goto LAB_00260976;
      }
    }
    else if (dVar4 < local_140) {
      pCVar11 = (CubicSpline *)*puVar15;
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15[1];
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        }
      }
      CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_158,&local_160);
LAB_00260976:
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
      }
    }
    if (cVar8 == '\0') {
      uVar20 = 0;
      uVar21 = 0x3ff00000;
      local_60 = 1.0;
    }
    else {
      lVar14 = *(long *)((long)&(((this->MixingMap).
                                  super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                                )._M_impl.super__Vector_impl_data + (long)local_d8 * 8);
      local_60 = *(double *)(lVar14 + 0x20 + lVar19);
      uVar2 = *(undefined8 *)(lVar14 + 0x28 + lVar19);
      uVar20 = (undefined4)uVar2;
      uVar21 = (undefined4)((ulong)uVar2 >> 0x20);
    }
    local_68 = (double)CONCAT44(uVar21,uVar20);
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    local_d8 = 0.0;
    dStack_d0 = 0.0;
    if (((local_150->isFluctuatingCharge == true) && (dVar4 = idat->flucQ1, dVar4 < local_a8)) &&
       (-local_58 < dVar4)) {
      local_d8 = ((local_58 + local_58 + dVar4 * 3.0 + local_a8) * (dVar4 - local_a8)) /
                 (local_a8 * local_a8 * (local_a8 + local_58));
      dStack_d0 = dStack_50;
    }
    if (((pEVar1->isFluctuatingCharge == true) && (dVar4 = idat->flucQ2, dVar4 < local_78)) &&
       (-local_48 < dVar4)) {
      local_c8 = ((local_48 + local_48 + dVar4 * 3.0 + local_78) * (dVar4 - local_78)) /
                 (local_78 * local_78 * (local_78 + local_48));
      dStack_c0 = dStack_40;
    }
    if ((*local_148 < local_b0) && (*local_148 < local_140)) {
      pCVar11 = (local_150->phiCV).
                super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var18 = (local_150->phiCV).
                super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        }
      }
      CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_e0,&local_e8);
      dVar5 = (double)local_118._0_8_ * 0.5 * local_60;
      dVar4 = local_138 / local_130;
      auVar28._8_8_ = (local_138 * local_100) / local_130;
      auVar28._0_8_ = local_108;
      auVar25._8_8_ = local_130;
      auVar25._0_8_ = local_130;
      auVar33 = divpd(auVar28,auVar25);
      local_158 = dVar5 * dVar4 * local_e0 + local_158;
      local_160 = (local_e8 * dVar4 + (auVar33._0_8_ - auVar33._8_8_) * local_e0) * dVar5 +
                  local_160;
      if (pEVar1->isFluctuatingCharge == true) {
        idat->dVdFQ2 = local_60 * local_c8 * 0.5 * dVar4 * local_e0 + idat->dVdFQ2;
      }
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
      }
    }
    if ((*local_148 < local_b8) && (*local_148 < local_140)) {
      pCVar11 = (pEVar1->phiCV).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var18 = (pEVar1->phiCV).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        }
      }
      CubicSpline::getValueAndDerivativeAt(pCVar11,local_148,&local_f0,&local_f8);
      dVar5 = local_128 * 0.5 * local_68;
      dVar4 = local_130 / local_138;
      auVar29._8_8_ = (local_130 * local_108) / local_138;
      auVar29._0_8_ = local_100;
      auVar26._8_8_ = local_138;
      auVar26._0_8_ = local_138;
      auVar33 = divpd(auVar29,auVar26);
      local_158 = dVar5 * dVar4 * local_f0 + local_158;
      local_160 = (local_f8 * dVar4 + (auVar33._0_8_ - auVar33._8_8_) * local_f0) * dVar5 +
                  local_160;
      if (local_150->isFluctuatingCharge == true) {
        idat->dVdFQ1 = local_68 * local_d8 * 0.5 * dVar4 * local_f0 + idat->dVdFQ1;
      }
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
      }
    }
  }
  dVar4 = (double)local_118._0_8_;
  dVar5 = local_128;
LAB_00260d7b:
  pEVar10 = local_150;
  dVar22 = idat->dfrho2;
  dVar3 = idat->dfrho1;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  lVar14 = 0;
  do {
    (&local_98)[lVar14] =
         (this->rhat).super_Vector<double,_3U>.data_[lVar14] *
         (dVar4 * local_108 * dVar3 + dVar5 * local_100 * dVar22 + local_160);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  lVar14 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar14] =
         (&local_98)[lVar14] + (idat->f1).super_Vector<double,_3U>.data_[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  if (idat->doParticlePot == true) {
    local_98 = idat->rho2 - local_130;
    RVar12 = CubicSpline::getValueAt
                       ((pEVar1->F).
                        super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_98);
    idat->particlePot1 = (RVar12 - idat->frho2) + idat->particlePot1;
    local_98 = idat->rho1 - local_138;
    RVar12 = CubicSpline::getValueAt
                       ((pEVar10->F).
                        super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_98);
    idat->particlePot2 = (RVar12 - idat->frho1) + idat->particlePot2;
  }
  (idat->pot).data_[4] = (idat->pot).data_[4] + local_158;
  if (idat->isSelected == true) {
    (idat->selePot).data_[4] = (idat->selePot).data_[4] + local_158;
  }
  idat->vpair = local_158 + idat->vpair;
  if (pEVar10->isFluctuatingCharge == true) {
    dVar4 = idat->dfrho2 * local_130;
    if (this->mixMeth_ == eamDream2) {
      idat->dVdFQ1 = dVar4 * local_d8 + idat->dVdFQ1;
    }
    else {
      idat->dVdFQ1 = idat->dVdFQ1 - dVar4 / local_a8;
    }
  }
  if (pEVar1->isFluctuatingCharge == true) {
    dVar4 = idat->dfrho1 * local_138;
    if (this->mixMeth_ == eamDream2) {
      idat->dVdFQ2 = dVar4 * local_c8 + idat->dVdFQ2;
    }
    else {
      idat->dVdFQ2 = idat->dVdFQ2 - dVar4 / local_78;
    }
  }
  return;
}

Assistant:

void EAM::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (haveCutoffRadius_)
      if (idat.rij > eamRcut_) return;

    int eamtid1        = EAMtids[idat.atid1];
    int eamtid2        = EAMtids[idat.atid2];
    EAMAtomData& data1 = EAMdata[eamtid1];
    EAMAtomData& data2 = EAMdata[eamtid2];

    // get type-specific cutoff radii

    RealType rci  = data1.rcut;
    RealType rcj  = data2.rcut;
    RealType rcij = MixingMap[eamtid1][eamtid2].rcut;

    RealType rha(0.0), drha(0.0), rhb(0.0), drhb(0.0);
    RealType pha(0.0), dpha(0.0), phb(0.0), dphb(0.0);

    RealType phab(0.0), dvpdr(0.0);
    RealType drhoidr(0.0), drhojdr(0.0), dudr(0.0);
    // For DREAM, we need nValence (Va, Vb), nMobile (Ma, Mb), for
    // each type, and density scaling variables (si, sj) for each atom:
    RealType Va(0.0), Vb(0.0);
    RealType Ma(0.0), Mb(0.0);
    RealType si(1.0), sj(1.0);
    RealType sip(0.0), sjp(0.0);
    RealType Ci(1.0), Cj(1.0);

    rhat = idat.d / idat.rij;
    if (idat.rij < rci && idat.rij < rcij) {
      data1.rho->getValueAndDerivativeAt(idat.rij, rha, drha);
      CubicSplinePtr phi = MixingMap[eamtid1][eamtid1].phi;
      phi->getValueAndDerivativeAt(idat.rij, pha, dpha);
    }

    if (idat.rij < rcj && idat.rij < rcij) {
      data2.rho->getValueAndDerivativeAt(idat.rij, rhb, drhb);
      CubicSplinePtr phi = MixingMap[eamtid2][eamtid2].phi;
      phi->getValueAndDerivativeAt(idat.rij, phb, dphb);
    }

    bool hasFlucQ   = data1.isFluctuatingCharge || data2.isFluctuatingCharge;
    bool isExplicit = MixingMap[eamtid1][eamtid2].explicitlySet;
    if (hasFlucQ) {
      if (data1.isFluctuatingCharge) {
        Va = data1.nValence;
        Ma = data1.nMobile;
        if (mixMeth_ == eamDream2)
          si = gFunc(idat.flucQ1, Va, Ma);
        else
          si = (Va - idat.flucQ1) / Va;
      }
      if (data2.isFluctuatingCharge) {
        Vb = data2.nValence;
        Mb = data2.nMobile;
        if (mixMeth_ == eamDream2)
          sj = gFunc(idat.flucQ2, Vb, Mb);
        else
          sj = (Vb - idat.flucQ2) / Vb;
      }

      if (mixMeth_ == eamJohnson || mixMeth_ == eamDream1) {
        if (idat.rij < rci && idat.rij < rcij) {
          phab  = phab + 0.5 * (sj / si) * (rhb / rha) * pha;
          dvpdr = dvpdr + 0.5 * (sj / si) *
                              ((rhb / rha) * dpha +
                               pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * (rhb * sj * pha) / (rha * Ma * si * si);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 -= 0.5 * (rhb * pha) / (rha * Mb * si);
          }
        }

        if (idat.rij < rcj && idat.rij < rcij) {
          phab  = phab + 0.5 * (si / sj) * (rha / rhb) * phb;
          dvpdr = dvpdr + 0.5 * (si / sj) *
                              ((rha / rhb) * dphb +
                               phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 -= 0.5 * (rha * phb) / (rhb * Ma * sj);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * (rha * si * phb) / (rhb * Mb * sj * sj);
          }
        }
      } else {
        if (isExplicit) {
          // phi is total potential for EAMTable and EAMZhou but CC interaction
          // for EAMOxide potential
          bool insideCutOff = (idat.rij < rcij);
          if (insideCutOff) {
            CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
            phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
          }

        } else {
          // Core-Core part first - no fluctuating charge, just Johnson mixing:

          if (idat.rij < rci && idat.rij < rcij) {
            CubicSplinePtr phiACC = data1.phiCC;
            phiACC->getValueAndDerivativeAt(idat.rij, pha, dpha);
            phab += 0.5 * (rhb / rha) * pha;
            dvpdr += 0.5 * ((rhb / rha) * dpha +
                            pha * ((drhb / rha) - (rhb * drha / rha / rha)));
          }
          if (idat.rij < rcj && idat.rij < rcij) {
            CubicSplinePtr phiBCC = data2.phiCC;
            phiBCC->getValueAndDerivativeAt(idat.rij, phb, dphb);
            phab += 0.5 * (rha / rhb) * phb;
            dvpdr += 0.5 * ((rha / rhb) * dphb +
                            phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));
          }
        }

        if (isExplicit) {
          // Ci, Cj are 0 for EAMTable and EAMZhou. So, there is no CV
          // interaction
          Ci = MixingMap[eamtid1][eamtid2].Ci;
          Cj = MixingMap[eamtid1][eamtid2].Cj;
        }
        // Core-Valence next, this does include fluctuating charges:

        if (data1.isFluctuatingCharge) { sip = gPrime(idat.flucQ1, Va, Ma); }
        if (data2.isFluctuatingCharge) { sjp = gPrime(idat.flucQ2, Vb, Mb); }

        if (idat.rij < rci && idat.rij < rcij) {
          CubicSplinePtr phiACV = data1.phiCV;
          phiACV->getValueAndDerivativeAt(idat.rij, pha, dpha);

          phab += 0.5 * sj * Ci * (rhb / rha) * pha;
          dvpdr += 0.5 * sj * Ci *
                   ((rhb / rha) * dpha +
                    pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * sjp * Ci * (rhb / rha) * pha;
          }
        }
        if (idat.rij < rcj && idat.rij < rcij) {
          CubicSplinePtr phiBCV = data2.phiCV;
          phiBCV->getValueAndDerivativeAt(idat.rij, phb, dphb);

          phab += 0.5 * si * Cj * (rha / rhb) * phb;
          dvpdr += 0.5 * si * Cj *
                   ((rha / rhb) * dphb +
                    phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * sip * Cj * (rha / rhb) * phb;
          }
        }
      }
    } else {
      if (idat.rij < rcij) {
        CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
        phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
      }
    }
    drhoidr = si * drha;
    drhojdr = sj * drhb;
    dudr    = drhojdr * idat.dfrho1 + drhoidr * idat.dfrho2 + dvpdr;

    idat.f1 += rhat * dudr;

    if (idat.doParticlePot) {
      // particlePot is the difference between the full potential and
      // the full potential without the presence of a particular
      // particle (atom1).
      //
      // This reduces the density at other particle locations, so we
      // need to recompute the density at atom2 assuming atom1 didn't
      // contribute.  This then requires recomputing the density
      // functional for atom2 as well.

      idat.particlePot1 += data2.F->getValueAt(idat.rho2 - rha) - idat.frho2;

      idat.particlePot2 += data1.F->getValueAt(idat.rho1 - rhb) - idat.frho1;
    }

    idat.pot[METALLIC_PAIR_FAMILY] += phab;
    if (idat.isSelected) idat.selePot[METALLIC_PAIR_FAMILY] += phab;

    idat.vpair += phab;

    // When densities are fluctuating, the functional depends on the
    // fluctuating densities from other sites:
    if (data1.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ1 += idat.dfrho2 * rha * sip;
      else
        idat.dVdFQ1 -= idat.dfrho2 * rha / Va;
    }
    if (data2.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ2 += idat.dfrho1 * rhb * sjp;
      else
        idat.dVdFQ2 -= idat.dfrho1 * rhb / Vb;
    }

    return;
  }